

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

int __thiscall Fl_File_Chooser::count(Fl_File_Chooser *this)

{
  int iVar1;
  char *pcVar2;
  char *filename;
  int fcount;
  int i;
  Fl_File_Chooser *this_local;
  
  pcVar2 = Fl_File_Input::value(this->fileName);
  if ((this->type_ & 1U) == 0) {
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    filename._4_4_ = 1;
    filename._0_4_ = 0;
    while( true ) {
      iVar1 = Fl_Browser::size(&this->fileList->super_Fl_Browser);
      if (iVar1 < filename._4_4_) break;
      iVar1 = Fl_Browser::selected(&this->fileList->super_Fl_Browser,filename._4_4_);
      if (iVar1 != 0) {
        filename._0_4_ = (int)filename + 1;
      }
      filename._4_4_ = filename._4_4_ + 1;
    }
    if ((int)filename == 0) {
      if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = (int)filename;
    }
  }
  return this_local._4_4_;
}

Assistant:

int				// O - Number of selected files
Fl_File_Chooser::count() {
  int		i;		// Looping var
  int		fcount;		// Number of selected files
  const char	*filename;	// Filename in input field or list


  filename = fileName->value();

  if (!(type_ & MULTI)) {
    // Check to see if the file name input field is blank...
    if (!filename || !filename[0]) return 0;
    else return 1;
  }

  for (i = 1, fcount = 0; i <= fileList->size(); i ++)
    if (fileList->selected(i)) {
      // See if this file is a directory...
      // matt: why would we do that? It is perfectly legal to select multiple
      // directories in a DIR chooser. They are visually selected and value(i)
      // returns all of them as expected
      //filename = (char *)fileList->text(i);

      //if (filename[strlen(filename) - 1] != '/')
	fcount ++;
    }

  if (fcount) return fcount;
  else if (!filename || !filename[0]) return 0;
  else return 1;
}